

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall kj::HttpHeaders::takeOwnership(HttpHeaders *this,Array<char> *chars)

{
  RemoveConst<kj::Array<char>_> **ppRVar1;
  RemoveConst<kj::Array<char>_> *pRVar2;
  RemoveConst<kj::Array<char>_> *pRVar3;
  size_t newSize;
  
  pRVar3 = (this->ownedStrings).builder.pos;
  if (pRVar3 == (this->ownedStrings).builder.endPtr) {
    pRVar2 = (this->ownedStrings).builder.ptr;
    newSize = 4;
    if (pRVar3 != pRVar2) {
      newSize = ((long)pRVar3 - (long)pRVar2 >> 3) * 0x5555555555555556;
    }
    Vector<kj::Array<char>_>::setCapacity(&this->ownedStrings,newSize);
    pRVar3 = (this->ownedStrings).builder.pos;
  }
  pRVar3->ptr = chars->ptr;
  pRVar3->size_ = chars->size_;
  pRVar3->disposer = chars->disposer;
  chars->ptr = (char *)0x0;
  chars->size_ = 0;
  ppRVar1 = &(this->ownedStrings).builder.pos;
  *ppRVar1 = *ppRVar1 + 1;
  return;
}

Assistant:

void HttpHeaders::takeOwnership(kj::Array<char>&& chars) {
  ownedStrings.add(kj::mv(chars));
}